

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::initVertexData(SRGBTestCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  SRGBTestCase *this_local;
  long lVar3;
  
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x708))(1,&this->m_vaoID);
  (**(code **)(lVar3 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_vertexDataID);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_vertexDataID);
  (**(code **)(lVar3 + 0x150))(0x8892,0x78,initVertexData::squareVertexData,0x88e4);
  (**(code **)(lVar3 + 0x19f0))(0,3,0x1406,0,0x14,0);
  (**(code **)(lVar3 + 0x610))(0);
  (**(code **)(lVar3 + 0x19f0))(1,2,0x1406,0,0x14,0xc);
  (**(code **)(lVar3 + 0x610))(1);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  return;
}

Assistant:

void SRGBTestCase::initVertexData (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	static const glw::GLfloat squareVertexData[] =
	{
		// position				// texcoord
		-1.0f, -1.0f, 0.0f,		0.0f, 0.0f, // bottom left corner
		 1.0f, -1.0f, 0.0f,		1.0f, 0.0f, // bottom right corner
		 1.0f,  1.0f, 0.0f,		1.0f, 1.0f, // Top right corner

		-1.0f,  1.0f, 0.0f,		0.0f, 1.0f, // top left corner
		 1.0f,  1.0f, 0.0f,		1.0f, 1.0f, // Top right corner
		-1.0f, -1.0f, 0.0f,		0.0f, 0.0f  // bottom left corner
	};

	DE_ASSERT(m_vaoID == 0);
	gl.genVertexArrays(1, &m_vaoID);
	gl.bindVertexArray(m_vaoID);

	gl.genBuffers(1, &m_vertexDataID);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexDataID);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizei)sizeof(squareVertexData), squareVertexData, GL_STATIC_DRAW);

	gl.vertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 5 * (glw::GLsizei)sizeof(GL_FLOAT), (glw::GLvoid *)0);
	gl.enableVertexAttribArray(0);
	gl.vertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 5 * (glw::GLsizei)sizeof(GL_FLOAT), (glw::GLvoid *)(3 * sizeof(GL_FLOAT)));
	gl.enableVertexAttribArray(1);

	gl.bindVertexArray(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
}